

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_buffer.cpp
# Opt level: O2

void __thiscall libtorrent::aux::packet_buffer::reserve(packet_buffer *this,uint32_t size)

{
  uint uVar1;
  ulong uVar2;
  index_type iVar3;
  ulong uVar4;
  ulong *puVar5;
  index_type iVar6;
  uint uVar7;
  pointer __p;
  pointer __p_00;
  __uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  local_38;
  
  uVar7 = this->m_capacity;
  uVar2 = 0x10;
  if (uVar7 != 0) {
    uVar2 = (ulong)uVar7;
  }
  do {
    uVar4 = uVar2;
    uVar1 = (uint)uVar4;
    uVar2 = (ulong)(uVar1 * 2);
  } while (uVar1 < size);
  puVar5 = (ulong *)operator_new__(uVar4 * 8 + 8);
  *puVar5 = uVar4;
  __p_00 = (pointer)(puVar5 + 1);
  if (uVar1 != 0) {
    memset(__p_00,0,uVar4 << 3);
  }
  iVar3 = this->m_first;
  for (iVar6 = iVar3; iVar6 < iVar3 + uVar7; iVar6 = iVar6 + 1) {
    ::std::__uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::operator=
              ((__uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
               (__p_00 + (iVar6 & uVar1 - 1)),
               (__uniq_ptr_impl<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
               ((ulong)(uVar7 - 1 & iVar6) * 8 +
               (long)(this->m_storage).
                     super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
                     ._M_t.
                     super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
                     .
                     super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
               ));
    uVar7 = this->m_capacity;
    iVar3 = this->m_first;
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  .
  super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  ._M_head_impl =
       (tuple<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
        )(_Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
          )0x0;
  ::std::
  __uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  ::reset((__uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
           *)this,__p_00);
  this->m_capacity = uVar1;
  ::std::
  unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  ::~unique_ptr((unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
                 *)&local_38);
  return;
}

Assistant:

void packet_buffer::reserve(std::uint32_t size)
	{
		INVARIANT_CHECK;
		TORRENT_ASSERT_VAL(size <= 0xffff, size);
		std::uint32_t new_size = m_capacity == 0 ? 16 : m_capacity;

		while (new_size < size)
			new_size <<= 1;

		aux::unique_ptr<packet_ptr[], index_type> new_storage(new packet_ptr[new_size]);

		for (index_type i = m_first; i < (m_first + m_capacity); ++i)
			new_storage[i & (new_size - 1)] = std::move(m_storage[i & (m_capacity - 1)]);

		m_storage = std::move(new_storage);
		m_capacity = new_size;
	}